

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions_1_5.cpp
# Opt level: O0

bool __thiscall QOpenGLFunctions_1_5::initializeOpenGLFunctions(QOpenGLFunctions_1_5 *this)

{
  bool bVar1;
  QAbstractOpenGLFunctions *this_00;
  QOpenGLContext *pQVar2;
  QAbstractOpenGLFunctions *pQVar3;
  QOpenGLVersionFunctionsBackend *pQVar4;
  long in_RDI;
  QOpenGLVersionFunctionsBackend *d;
  QOpenGLContext *context;
  undefined4 in_stack_ffffffffffffff78;
  Version in_stack_ffffffffffffff7c;
  QAbstractOpenGLFunctions *in_stack_ffffffffffffff80;
  bool local_1;
  
  bVar1 = QAbstractOpenGLFunctions::isInitialized(in_stack_ffffffffffffff80);
  if (bVar1) {
    local_1 = true;
  }
  else {
    this_00 = (QAbstractOpenGLFunctions *)QOpenGLContext::currentContext();
    pQVar2 = QAbstractOpenGLFunctions::owningContext(in_stack_ffffffffffffff80);
    if ((((pQVar2 != (QOpenGLContext *)0x0) &&
         (pQVar3 = (QAbstractOpenGLFunctions *)
                   QAbstractOpenGLFunctions::owningContext(in_stack_ffffffffffffff80),
         pQVar3 == this_00)) ||
        (pQVar2 = QAbstractOpenGLFunctions::owningContext(in_stack_ffffffffffffff80),
        pQVar2 == (QOpenGLContext *)0x0)) &&
       (bVar1 = isContextCompatible((QOpenGLContext *)
                                    CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)),
       bVar1)) {
      QOpenGLFunctions_1_0_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend
                         ((QOpenGLContext *)this_00,in_stack_ffffffffffffff7c);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x10) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1b9cfc);
      QOpenGLFunctions_1_1_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend
                         ((QOpenGLContext *)this_00,in_stack_ffffffffffffff7c);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x18) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1b9d3b);
      QOpenGLFunctions_1_2_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend
                         ((QOpenGLContext *)this_00,in_stack_ffffffffffffff7c);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x20) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1b9d7a);
      QOpenGLFunctions_1_3_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend
                         ((QOpenGLContext *)this_00,in_stack_ffffffffffffff7c);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x28) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1b9db9);
      QOpenGLFunctions_1_4_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend
                         ((QOpenGLContext *)this_00,in_stack_ffffffffffffff7c);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x30) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1b9df8);
      QOpenGLFunctions_1_5_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend
                         ((QOpenGLContext *)this_00,in_stack_ffffffffffffff7c);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x38) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1b9e37);
      QOpenGLFunctions_1_0_DeprecatedBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend
                         ((QOpenGLContext *)this_00,in_stack_ffffffffffffff7c);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x40) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1b9e76);
      QOpenGLFunctions_1_1_DeprecatedBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend
                         ((QOpenGLContext *)this_00,in_stack_ffffffffffffff7c);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x48) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1b9eb5);
      QOpenGLFunctions_1_2_DeprecatedBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend
                         ((QOpenGLContext *)this_00,in_stack_ffffffffffffff7c);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x50) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1b9ef4);
      QOpenGLFunctions_1_3_DeprecatedBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend
                         ((QOpenGLContext *)this_00,in_stack_ffffffffffffff7c);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x58) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1b9f33);
      QOpenGLFunctions_1_4_DeprecatedBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend
                         ((QOpenGLContext *)this_00,in_stack_ffffffffffffff7c);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x60) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1b9f72);
      QAbstractOpenGLFunctions::initializeOpenGLFunctions(this_00);
      in_stack_ffffffffffffff80 = this_00;
    }
    local_1 = QAbstractOpenGLFunctions::isInitialized(in_stack_ffffffffffffff80);
  }
  return local_1;
}

Assistant:

bool QOpenGLFunctions_1_5::initializeOpenGLFunctions()
{
    if ( isInitialized() )
        return true;

    QOpenGLContext* context = QOpenGLContext::currentContext();

    // If owned by a context object make sure it is current.
    // Also check that current context is capable of resolving all needed functions
    if (((owningContext() && owningContext() == context) || !owningContext())
        && QOpenGLFunctions_1_5::isContextCompatible(context))
    {
        // Associate with private implementation, creating if necessary
        // Function pointers in the backends are resolved at creation time
        QOpenGLVersionFunctionsBackend* d = nullptr;
        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_0_CoreBackend::versionStatus());
        d_1_0_Core = static_cast<QOpenGLFunctions_1_0_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_1_CoreBackend::versionStatus());
        d_1_1_Core = static_cast<QOpenGLFunctions_1_1_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_2_CoreBackend::versionStatus());
        d_1_2_Core = static_cast<QOpenGLFunctions_1_2_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_3_CoreBackend::versionStatus());
        d_1_3_Core = static_cast<QOpenGLFunctions_1_3_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_4_CoreBackend::versionStatus());
        d_1_4_Core = static_cast<QOpenGLFunctions_1_4_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_5_CoreBackend::versionStatus());
        d_1_5_Core = static_cast<QOpenGLFunctions_1_5_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_0_DeprecatedBackend::versionStatus());
        d_1_0_Deprecated = static_cast<QOpenGLFunctions_1_0_DeprecatedBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_1_DeprecatedBackend::versionStatus());
        d_1_1_Deprecated = static_cast<QOpenGLFunctions_1_1_DeprecatedBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_2_DeprecatedBackend::versionStatus());
        d_1_2_Deprecated = static_cast<QOpenGLFunctions_1_2_DeprecatedBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_3_DeprecatedBackend::versionStatus());
        d_1_3_Deprecated = static_cast<QOpenGLFunctions_1_3_DeprecatedBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_4_DeprecatedBackend::versionStatus());
        d_1_4_Deprecated = static_cast<QOpenGLFunctions_1_4_DeprecatedBackend*>(d);
        d->refs.ref();

        QAbstractOpenGLFunctions::initializeOpenGLFunctions();
    }
    return isInitialized();
}